

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O2

ON_NurbsCurve * __thiscall
ON_Curve::NurbsCurve
          (ON_Curve *this,ON_NurbsCurve *pNurbsCurve,double tolerance,ON_Interval *subdomain)

{
  int iVar1;
  ON_NurbsCurve *this_00;
  ON_NurbsCurve *pOVar2;
  
  this_00 = pNurbsCurve;
  if (pNurbsCurve == (ON_NurbsCurve *)0x0) {
    this_00 = (ON_NurbsCurve *)operator_new(0x40);
    ON_NurbsCurve::ON_NurbsCurve(this_00);
  }
  iVar1 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3f])
                    (tolerance,this,this_00,subdomain);
  pOVar2 = (ON_NurbsCurve *)0x0;
  if (iVar1 != 0) {
    pOVar2 = this_00;
  }
  if ((pNurbsCurve == (ON_NurbsCurve *)0x0) && (iVar1 == 0)) {
    (*(this_00->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(this_00);
    pOVar2 = (ON_NurbsCurve *)0x0;
  }
  return pOVar2;
}

Assistant:

ON_NurbsCurve* ON_Curve::NurbsCurve(
      ON_NurbsCurve* pNurbsCurve,
      double tolerance,
      const ON_Interval* subdomain
      ) const
{
  ON_NurbsCurve* nurbs_curve = pNurbsCurve;
  if ( !nurbs_curve )
    nurbs_curve = new ON_NurbsCurve();
  int rc = GetNurbForm( *nurbs_curve, tolerance, subdomain );
  if ( !rc )
  {
    if (!pNurbsCurve)
      delete nurbs_curve;
    nurbs_curve = nullptr;
  }
  return nurbs_curve;
}